

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastV8R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  char *pcVar7;
  ParseContext *pPVar8;
  ParseContext *extraout_RDX;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  uint uVar11;
  uint *puVar12;
  RepeatedField<bool> *this;
  ulong unaff_R14;
  undefined7 uVar9;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  this = (RepeatedField<bool> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  uVar2 = *(ushort *)ptr;
  pPVar8 = ctx;
  pcVar7 = ptr;
  do {
    aVar10.data = (long)ptr + 3;
    bVar1 = *(byte *)((long)ptr + 2);
    uVar9 = (undefined7)((ulong)pPVar8 >> 8);
    pPVar8 = (ParseContext *)CONCAT71(uVar9,bVar1);
    if (bVar1 < 2) {
      unaff_R14 = (ulong)pPVar8 & 0xffffffff;
      ptr = (char *)aVar10.data;
    }
    else {
      bVar4 = 1;
      if ((char)bVar1 < '\0') {
        pPVar8 = (ParseContext *)(CONCAT71(uVar9,bVar1) & 0xffffffffffffff7f);
        bVar5 = *(byte *)((long)ptr + 3);
        aVar10._1_7_ = (undefined7)((ulong)aVar10 >> 8);
        bVar4 = bVar1 & 0x7f | bVar5;
        if ((char)bVar5 < '\0') {
          bVar5 = bVar1 & 0x7f | bVar5 & 0x7f;
          bVar1 = *(byte *)((long)ptr + 4);
          bVar4 = bVar5 | bVar1;
          if ((char)bVar1 < '\0') {
            bVar5 = bVar5 | bVar1 & 0x7f;
            bVar1 = *(byte *)((long)ptr + 5);
            bVar4 = bVar5 | bVar1;
            if ((char)bVar1 < '\0') {
              bVar5 = bVar5 | bVar1 & 0x7f;
              bVar1 = *(byte *)((long)ptr + 6);
              bVar4 = bVar5 | bVar1;
              if ((char)bVar1 < '\0') {
                bVar5 = bVar5 | bVar1 & 0x7f;
                bVar1 = *(byte *)((long)ptr + 7);
                bVar4 = bVar5 | bVar1;
                if ((char)bVar1 < '\0') {
                  bVar5 = bVar5 | bVar1 & 0x7f;
                  bVar1 = *(byte *)((long)ptr + 8);
                  bVar4 = bVar5 | bVar1;
                  if ((char)bVar1 < '\0') {
                    bVar5 = bVar5 | bVar1 & 0x7f;
                    bVar1 = *(byte *)((long)ptr + 9);
                    bVar4 = bVar5 | bVar1;
                    if ((char)bVar1 < '\0') {
                      bVar5 = bVar5 | bVar1 & 0x7f;
                      bVar1 = *(byte *)((long)ptr + 10);
                      bVar4 = bVar5 | bVar1;
                      if ((char)bVar1 < '\0') {
                        bVar4 = *(byte *)((long)ptr + 0xb);
                        aVar10.data._0_1_ = bVar4;
                        if ((char)bVar4 < '\0') {
                          ptr = (char *)0;
                          goto LAB_002c56f9;
                        }
                        aVar10.data = (long)ptr + 0xc;
                        bVar4 = bVar5 | bVar1 & 0x7f | bVar4 & 0x81;
                      }
                      else {
                        aVar10.data = (long)ptr + 0xb;
                      }
                    }
                    else {
                      aVar10.data = (long)ptr + 10;
                    }
                  }
                  else {
                    aVar10.data = (long)ptr + 9;
                  }
                }
                else {
                  aVar10.data = (long)ptr + 8;
                }
              }
              else {
                aVar10.data = (long)ptr + 7;
              }
            }
            else {
              aVar10.data = (long)ptr + 6;
            }
          }
          else {
            aVar10.data = (long)ptr + 5;
          }
        }
        else {
          aVar10.data = (long)ptr + 4;
        }
      }
      unaff_R14 = (ulong)(bVar4 != 0);
      ptr = (char *)aVar10;
    }
LAB_002c56f9:
    if ((ushort *)ptr == (ushort *)0x0) {
      pcVar7 = Error(msg,pcVar7,pPVar8,(TcFieldData)aVar10,table,hasbits);
      return pcVar7;
    }
    uVar11 = (uint)unaff_R14 & 1;
    pcVar7 = (char *)(ulong)uVar11;
    RepeatedField<bool>::Add(this,SUB41(uVar11,0));
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar12 & 3) != 0) {
          AlignFail();
        }
        *puVar12 = *puVar12 | (uint)hasbits;
      }
      return (char *)(uint64_t)ptr;
    }
    uVar3 = *(ushort *)ptr;
    pPVar8 = extraout_RDX;
    if (uVar3 != uVar2) {
      uVar11 = (uint)table->fast_idx_mask & (uint)uVar3;
      if ((uVar11 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar6 = (ulong)(uVar11 & 0xfffffff8);
      pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                                 (msg,ptr,ctx,
                                  (ulong)uVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),
                                  table,hasbits);
      return pcVar7;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<bool, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}